

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

int BUFFER_append(BUFFER_HANDLE handle1,BUFFER_HANDLE handle2)

{
  ulong uVar1;
  size_t sVar2;
  uchar *puVar3;
  LOGGER_LOG p_Var4;
  int iVar5;
  size_t sVar6;
  BUFFER *b1;
  
  iVar5 = 0x1db;
  if (((handle1 != handle2) && (handle1 != (BUFFER_HANDLE)0x0)) && (handle2 != (BUFFER_HANDLE)0x0))
  {
    if (handle1->buffer == (uchar *)0x0) {
      iVar5 = 0x1e4;
    }
    else if (handle2->buffer == (uchar *)0x0) {
      iVar5 = 0x1e9;
    }
    else {
      uVar1 = handle2->size;
      iVar5 = 0;
      if (uVar1 != 0) {
        sVar6 = 0xffffffffffffffff;
        if (!CARRY8(uVar1,handle1->size)) {
          sVar6 = uVar1 + handle1->size;
        }
        if ((sVar6 != 0xffffffffffffffff) &&
           (puVar3 = (uchar *)realloc(handle1->buffer,sVar6), puVar3 != (uchar *)0x0)) {
          handle1->buffer = puVar3;
          sVar2 = handle1->size;
          sVar6 = handle2->size;
          memcpy(puVar3 + sVar2,handle2->buffer,sVar6);
          handle1->size = sVar6 + sVar2;
          return 0;
        }
        p_Var4 = xlogging_get_log_function();
        iVar5 = 0x1fc;
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/buffer.c"
                    ,"BUFFER_append",0x1fb,1,"Failure: allocating temp buffer.");
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int BUFFER_append(BUFFER_HANDLE handle1, BUFFER_HANDLE handle2)
{
    int result;
    if ( (handle1 == NULL) || (handle2 == NULL) || (handle1 == handle2) )
    {
        /* Codes_SRS_BUFFER_07_023: [BUFFER_append shall return a nonzero upon any error that is encountered.] */
        result = MU_FAILURE;
    }
    else
    {
        BUFFER* b1 = (BUFFER*)handle1;
        BUFFER* b2 = (BUFFER*)handle2;
        if (b1->buffer == NULL)
        {
            /* Codes_SRS_BUFFER_07_023: [BUFFER_append shall return a nonzero upon any error that is encountered.] */
            result = MU_FAILURE;
        }
        else if (b2->buffer == NULL)
        {
            /* Codes_SRS_BUFFER_07_023: [BUFFER_append shall return a nonzero upon any error that is encountered.] */
            result = MU_FAILURE;
        }
        else
        {
            if (b2->size ==0)
            {
                // b2->size = 0, whatever b1->size is, do nothing
                result = 0;
            }
            else
            {
                // b2->size != 0, whatever b1->size is
                unsigned char* temp;
                size_t malloc_size = safe_add_size_t(b1->size, b2->size);
                if (malloc_size == SIZE_MAX || 
                    (temp = (unsigned char*)realloc(b1->buffer, malloc_size)) == NULL)
                {
                    /* Codes_SRS_BUFFER_07_023: [BUFFER_append shall return a nonzero upon any error that is encountered.] */
                    LogError("Failure: allocating temp buffer.");
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_SRS_BUFFER_07_024: [BUFFER_append concatenates b2 onto b1 without modifying b2 and shall return zero on success.]*/
                    b1->buffer = temp;
                    // Append the BUFFER
                    (void)memcpy(&b1->buffer[b1->size], b2->buffer, b2->size);
                    b1->size += b2->size;
                    result = 0;
                }
            }
        }
    }
    return result;
}